

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

PixelBufferAccess *
deqp::gls::FragmentOpUtil::getMultisampleAccess
          (PixelBufferAccess *__return_storage_ptr__,PixelBufferAccess *original)

{
  int height;
  int depth;
  int rowPitch;
  int slicePitch;
  TextureFormat *format;
  TextureFormat *this;
  void *data;
  PixelBufferAccess *original_local;
  
  format = tcu::ConstPixelBufferAccess::getFormat(&original->super_ConstPixelBufferAccess);
  height = tcu::ConstPixelBufferAccess::getWidth(&original->super_ConstPixelBufferAccess);
  depth = tcu::ConstPixelBufferAccess::getHeight(&original->super_ConstPixelBufferAccess);
  this = tcu::ConstPixelBufferAccess::getFormat(&original->super_ConstPixelBufferAccess);
  rowPitch = tcu::TextureFormat::getPixelSize(this);
  slicePitch = tcu::ConstPixelBufferAccess::getRowPitch(&original->super_ConstPixelBufferAccess);
  data = tcu::PixelBufferAccess::getDataPtr(original);
  tcu::PixelBufferAccess::PixelBufferAccess
            (__return_storage_ptr__,format,1,height,depth,rowPitch,slicePitch,data);
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess getMultisampleAccess(const tcu::PixelBufferAccess& original)
{
	return tcu::PixelBufferAccess(original.getFormat(),
								  1,
								  original.getWidth(),
								  original.getHeight(),
								  original.getFormat().getPixelSize(),
								  original.getRowPitch(),
								  original.getDataPtr());
}